

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O3

void DC16NoLeft_SSE2(uint8_t *dst)

{
  uint8_t *puVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined4 uVar6;
  undefined1 auVar9 [16];
  
  auVar9 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])(dst + -0x20));
  uVar3 = CONCAT22(auVar9._10_2_ + auVar9._2_2_,auVar9._8_2_ + auVar9._0_2_) + 8;
  uVar4 = uVar3 >> 4;
  bVar2 = (byte)(uVar3 >> 0x18);
  uVar8 = (undefined1)(uVar4 >> 0x10);
  uVar7 = (undefined1)(uVar4 >> 8);
  auVar9._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(bVar2 >> 4,bVar2 >> 4),uVar8),
                                CONCAT14(uVar8,uVar4)) >> 0x20);
  auVar9[3] = uVar7;
  auVar9[2] = uVar7;
  auVar9[0] = (undefined1)uVar4;
  auVar9[1] = auVar9[0];
  auVar9._8_8_ = 0;
  auVar9 = pshuflw(auVar9,auVar9,0);
  uVar6 = auVar9._0_4_;
  lVar5 = 0;
  do {
    puVar1 = dst + lVar5;
    *(undefined4 *)puVar1 = uVar6;
    *(undefined4 *)(puVar1 + 4) = uVar6;
    *(undefined4 *)(puVar1 + 8) = uVar6;
    *(undefined4 *)(puVar1 + 0xc) = uVar6;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x200);
  return;
}

Assistant:

static void DC16NoLeft_SSE2(uint8_t* dst) {  // DC with left samples unavailable
  const __m128i zero = _mm_setzero_si128();
  const __m128i top = _mm_loadu_si128((const __m128i*)(dst - BPS));
  const __m128i sad8x2 = _mm_sad_epu8(top, zero);
  // sum the two sads: sad8x2[0:1] + sad8x2[8:9]
  const __m128i sum = _mm_add_epi16(sad8x2, _mm_shuffle_epi32(sad8x2, 2));
  const int DC = _mm_cvtsi128_si32(sum) + 8;
  Put16_SSE2(DC >> 4, dst);
}